

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O1

void __thiscall
GdlBinaryExpression::GdlBinaryExpression
          (GdlBinaryExpression *this,Symbol psymOperator,GdlExpression *pexpOp1,
          GdlExpression *pexpOp2)

{
  GdlObject *this_00;
  GdlExpression *pGVar1;
  
  this_00 = &(this->super_GdlExpression).super_GdlObject;
  GdlObject::GdlObject(this_00);
  (this->super_GdlExpression).m_exptResult = kexptUnknown;
  (this->super_GdlExpression)._vptr_GdlExpression = (_func_int **)&PTR_Clone_002423f8;
  this->m_psymOperator = psymOperator;
  this->m_pexpOperand1 = pexpOp1;
  this->m_pexpOperand2 = pexpOp2;
  if ((pexpOp1 != (GdlExpression *)0x0) && ((pexpOp1->super_GdlObject).m_lnf.m_nLinePre == 0)) {
    (*pexpOp1->_vptr_GdlExpression[4])(pexpOp1,this_00);
  }
  pGVar1 = this->m_pexpOperand2;
  if ((pGVar1 != (GdlExpression *)0x0) && ((pGVar1->super_GdlObject).m_lnf.m_nLinePre == 0)) {
    (*pGVar1->_vptr_GdlExpression[4])(pGVar1,this_00);
  }
  return;
}

Assistant:

GdlBinaryExpression(Symbol psymOperator, GdlExpression * pexpOp1, GdlExpression * pexpOp2)
		:	GdlExpression(),
			m_psymOperator(psymOperator),
			m_pexpOperand1(pexpOp1),
			m_pexpOperand2(pexpOp2)
	{
		if (m_pexpOperand1 && m_pexpOperand1->LineIsZero())
			m_pexpOperand1->PropagateLineAndFile(m_lnf);
		if (m_pexpOperand2 && m_pexpOperand2->LineIsZero())
			m_pexpOperand2->PropagateLineAndFile(m_lnf);
	}